

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O2

void __thiscall
ContractHashUtil_GetContractScriptOpTrue_Test::TestBody
          (ContractHashUtil_GetContractScriptOpTrue_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_f0;
  Script local_e8;
  Script script;
  Script fedpeg_script;
  Script claim_script;
  
  std::__cxx11::string::string
            ((string *)&fedpeg_script,"0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb",
             (allocator *)&script);
  cfd::core::Script::Script(&claim_script,(string *)&fedpeg_script);
  std::__cxx11::string::~string((string *)&fedpeg_script);
  std::__cxx11::string::string((string *)&script,"51",(allocator *)&local_e8);
  cfd::core::Script::Script(&fedpeg_script,(string *)&script);
  std::__cxx11::string::~string((string *)&script);
  cfd::core::Script::Script(&script);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ContractHashUtil::GetContractScript(&local_e8,&claim_script,&fedpeg_script);
      cfd::core::Script::operator=(&script,&local_e8);
      cfd::core::Script::~Script(&local_e8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_contracthashutil.cpp"
               ,0x3b,
               "Expected: (script = ContractHashUtil::GetContractScript(claim_script, fedpeg_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)&local_e8,&script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"script.GetHex().c_str()","\"51\"",(char *)local_e8._vptr_Script,
             "51");
  std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_contracthashutil.cpp"
               ,0x3c,message);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::~Script(&script);
  cfd::core::Script::~Script(&fedpeg_script);
  cfd::core::Script::~Script(&claim_script);
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScriptOpTrue) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  Script fedpeg_script("51");  // OP_TRUE
  Script script;
  EXPECT_NO_THROW(
      (script = ContractHashUtil::GetContractScript(claim_script,
          fedpeg_script)));
  EXPECT_STREQ(script.GetHex().c_str(), "51");
}